

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_libapi.cpp
# Opt level: O0

ze_result_t
zeDriverRTASFormatCompatibilityCheckExt
          (ze_driver_handle_t hDriver,ze_rtas_format_ext_t rtasFormatA,
          ze_rtas_format_ext_t rtasFormatB)

{
  ze_pfnDriverRTASFormatCompatibilityCheckExt_t p_Var1;
  __pointer_type p_Var2;
  ze_pfnDriverRTASFormatCompatibilityCheckExt_t pfnRTASFormatCompatibilityCheckExt;
  ze_rtas_format_ext_t rtasFormatB_local;
  ze_rtas_format_ext_t rtasFormatA_local;
  ze_driver_handle_t hDriver_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_ze_dditable_t_*>::load
                       ((atomic<_ze_dditable_t_*> *)(ze_lib::context + 0x10),memory_order_seq_cst);
    p_Var1 = (p_Var2->Driver).pfnRTASFormatCompatibilityCheckExt;
    if (p_Var1 == (ze_pfnDriverRTASFormatCompatibilityCheckExt_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hDriver_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hDriver_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hDriver_local._4_4_ = (*p_Var1)(hDriver,rtasFormatA,rtasFormatB);
    }
  }
  else {
    hDriver_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hDriver_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zeDriverRTASFormatCompatibilityCheckExt(
    ze_driver_handle_t hDriver,                     ///< [in] handle of driver object
    ze_rtas_format_ext_t rtasFormatA,               ///< [in] operand A
    ze_rtas_format_ext_t rtasFormatB                ///< [in] operand B
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const ze_pfnDriverRTASFormatCompatibilityCheckExt_t pfnRTASFormatCompatibilityCheckExt = [&result] {
        auto pfnRTASFormatCompatibilityCheckExt = ze_lib::context->zeDdiTable.load()->Driver.pfnRTASFormatCompatibilityCheckExt;
        if( nullptr == pfnRTASFormatCompatibilityCheckExt ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnRTASFormatCompatibilityCheckExt;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnRTASFormatCompatibilityCheckExt( hDriver, rtasFormatA, rtasFormatB );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnRTASFormatCompatibilityCheckExt = ze_lib::context->zeDdiTable.load()->Driver.pfnRTASFormatCompatibilityCheckExt;
    if( nullptr == pfnRTASFormatCompatibilityCheckExt ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnRTASFormatCompatibilityCheckExt( hDriver, rtasFormatA, rtasFormatB );
    #endif
}